

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_left_delim_join.cpp
# Opt level: O3

unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true> __thiscall
duckdb::PhysicalLeftDelimJoin::GetLocalSinkState
          (PhysicalLeftDelimJoin *this,ExecutionContext *context)

{
  ClientContext *context_00;
  _Head_base<0UL,_duckdb::LocalSinkState_*,_false> _Var1;
  _Head_base<0UL,_duckdb::LocalSinkState_*,_false> _Var2;
  LeftDelimJoinLocalState *this_00;
  pointer pLVar3;
  undefined8 *in_RDX;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::LocalSinkState_*,_false> local_38;
  _Head_base<0UL,_duckdb::LeftDelimJoinLocalState_*,_false> local_30;
  
  context_00 = (ClientContext *)*in_RDX;
  this_00 = (LeftDelimJoinLocalState *)operator_new(0x100);
  LeftDelimJoinLocalState::LeftDelimJoinLocalState
            (this_00,context_00,(PhysicalLeftDelimJoin *)context);
  local_30._M_head_impl = this_00;
  (**(code **)&((context[5].pipeline.ptr)->super_enable_shared_from_this<duckdb::Pipeline>).
               __weak_this_.internal.super___weak_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr[1].ready)(&local_38);
  pLVar3 = unique_ptr<duckdb::LeftDelimJoinLocalState,_std::default_delete<duckdb::LeftDelimJoinLocalState>,_true>
           ::operator->((unique_ptr<duckdb::LeftDelimJoinLocalState,_std::default_delete<duckdb::LeftDelimJoinLocalState>,_true>
                         *)&local_30);
  _Var2._M_head_impl = local_38._M_head_impl;
  local_38._M_head_impl = (LocalSinkState *)0x0;
  _Var1._M_head_impl =
       (pLVar3->distinct_state).
       super_unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>._M_t.
       super___uniq_ptr_impl<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::LocalSinkState_*,_std::default_delete<duckdb::LocalSinkState>_>
       .super__Head_base<0UL,_duckdb::LocalSinkState_*,_false>._M_head_impl;
  (pLVar3->distinct_state).
  super_unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>._M_t.
  super___uniq_ptr_impl<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::LocalSinkState_*,_std::default_delete<duckdb::LocalSinkState>_>.
  super__Head_base<0UL,_duckdb::LocalSinkState_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (_Var1._M_head_impl != (LocalSinkState *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_LocalSinkState + 8))();
    if (local_38._M_head_impl != (LocalSinkState *)0x0) {
      (*(local_38._M_head_impl)->_vptr_LocalSinkState[1])();
    }
  }
  (this->super_PhysicalDelimJoin).super_PhysicalOperator._vptr_PhysicalOperator =
       (_func_int **)local_30._M_head_impl;
  return (unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>)
         (unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>)this;
}

Assistant:

unique_ptr<LocalSinkState> PhysicalLeftDelimJoin::GetLocalSinkState(ExecutionContext &context) const {
	auto state = make_uniq<LeftDelimJoinLocalState>(context.client, *this);
	state->distinct_state = distinct.GetLocalSinkState(context);
	return std::move(state);
}